

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

SRC_ERROR sinc_stereo_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  int iVar1;
  SINC_FILTER *filter_00;
  int iVar2;
  int iVar3;
  int iVar4;
  SRC_ERROR SVar5;
  increment_t increment_00;
  increment_t start_filter_index_00;
  double dVar6;
  double x;
  double local_98;
  double local_78;
  double local_70;
  int samples_in_hand;
  int half_filter_chan_len;
  increment_t start_filter_index;
  increment_t increment;
  double rem;
  double terminate;
  double float_increment;
  double count;
  double src_ratio;
  double input_index;
  SINC_FILTER *filter;
  SRC_DATA *data_local;
  SRC_STATE *state_local;
  
  if (state->private_data == (void *)0x0) {
    state_local._4_4_ = SRC_ERR_NO_PRIVATE;
  }
  else {
    filter_00 = (SINC_FILTER *)state->private_data;
    filter_00->in_count = data->input_frames * (long)state->channels;
    filter_00->out_count = data->output_frames * (long)state->channels;
    filter_00->out_gen = 0;
    filter_00->in_used = 0;
    count = state->last_ratio;
    iVar2 = is_bad_src_ratio(count);
    if (iVar2 == 0) {
      float_increment = ((double)filter_00->coeff_half_len + 2.0) / (double)filter_00->index_inc;
      if (data->src_ratio <= state->last_ratio) {
        local_70 = data->src_ratio;
      }
      else {
        local_70 = state->last_ratio;
      }
      if (local_70 < 1.0) {
        if (data->src_ratio <= state->last_ratio) {
          local_78 = data->src_ratio;
        }
        else {
          local_78 = state->last_ratio;
        }
        float_increment = float_increment / local_78;
      }
      iVar2 = state->channels;
      iVar3 = psf_lrint(float_increment);
      iVar2 = iVar2 * (iVar3 + 1);
      dVar6 = state->last_position;
      src_ratio = fmod_one(dVar6);
      iVar3 = filter_00->b_current;
      iVar1 = state->channels;
      iVar4 = psf_lrint(dVar6 - src_ratio);
      filter_00->b_current = (iVar3 + iVar1 * iVar4) % filter_00->b_len;
      dVar6 = 1.0 / count;
      while (filter_00->out_gen < filter_00->out_count) {
        if (((filter_00->b_end - filter_00->b_current) + filter_00->b_len) % filter_00->b_len <=
            iVar2) {
          SVar5 = prepare_data(filter_00,state->channels,data,iVar2);
          state->error = SVar5;
          if (SVar5 != SRC_ERR_NO_ERROR) {
            return state->error;
          }
          if (((filter_00->b_end - filter_00->b_current) + filter_00->b_len) % filter_00->b_len <=
              iVar2) break;
        }
        if ((-1 < filter_00->b_real_end) &&
           ((double)filter_00->b_real_end <=
            (double)filter_00->b_current + src_ratio + dVar6 + 1e-20)) break;
        if ((0 < filter_00->out_count) && (1e-10 < ABS(state->last_ratio - data->src_ratio))) {
          count = state->last_ratio +
                  ((double)filter_00->out_gen * (data->src_ratio - state->last_ratio)) /
                  (double)filter_00->out_count;
        }
        if (1.0 <= count) {
          local_98 = 1.0;
        }
        else {
          local_98 = count;
        }
        local_98 = (double)filter_00->index_inc * local_98;
        increment_00 = double_to_fp(local_98);
        start_filter_index_00 = double_to_fp(src_ratio * local_98);
        calc_output_stereo(filter_00,state->channels,increment_00,start_filter_index_00,
                           local_98 / (double)filter_00->index_inc,
                           data->data_out + filter_00->out_gen);
        filter_00->out_gen = filter_00->out_gen + 2;
        x = 1.0 / count + src_ratio;
        src_ratio = fmod_one(x);
        iVar3 = filter_00->b_current;
        iVar1 = state->channels;
        iVar4 = psf_lrint(x - src_ratio);
        filter_00->b_current = (iVar3 + iVar1 * iVar4) % filter_00->b_len;
      }
      state->last_position = src_ratio;
      state->last_ratio = count;
      data->input_frames_used = filter_00->in_used / (long)state->channels;
      data->output_frames_gen = filter_00->out_gen / (long)state->channels;
      state_local._4_4_ = SRC_ERR_NO_ERROR;
    }
    else {
      state_local._4_4_ = SRC_ERR_BAD_INTERNAL_STATE;
    }
  }
  return state_local._4_4_;
}

Assistant:

SRC_ERROR
sinc_stereo_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_stereo (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 2 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}